

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall String::String(String *this,char *str,usize length)

{
  Data *pDVar1;
  
  pDVar1 = (Data *)operator_new__((length | 3) + 0x21);
  this->data = pDVar1;
  pDVar1->str = (char *)(pDVar1 + 1);
  Memory::copy((Memory *)(pDVar1 + 1),(EVP_PKEY_CTX *)str,(EVP_PKEY_CTX *)length);
  pDVar1 = this->data;
  pDVar1->len = length;
  pDVar1->str[length] = '\0';
  pDVar1 = this->data;
  pDVar1->ref = 1;
  pDVar1->capacity = length | 3;
  return;
}

Assistant:

String(const char* str, usize length)
  {
    usize capacity = length | 0x3;
    data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    data->str = (char*)((byte*)data + sizeof(Data));
    Memory::copy((char*)data->str, str, length * sizeof(char));
    ((char*)data->str)[data->len = length] = '\0';
    data->ref = 1;
    data->capacity = capacity;
  }